

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O0

void __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushOperand
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,
          Stack<rapidjson::CrtAllocator> *operandStack,uint codepoint)

{
  Frag *pFVar1;
  Frag local_2c;
  SizeType local_20;
  uint local_1c;
  SizeType s;
  uint codepoint_local;
  Stack<rapidjson::CrtAllocator> *operandStack_local;
  GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  local_1c = codepoint;
  _s = operandStack;
  operandStack_local = (Stack<rapidjson::CrtAllocator> *)this;
  local_20 = NewState(this,0xffffffff,0xffffffff,codepoint);
  Frag::Frag(&local_2c,local_20,local_20,local_20);
  pFVar1 = Stack<rapidjson::CrtAllocator>::
           Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                     (_s,1);
  pFVar1->start = local_2c.start;
  pFVar1->out = local_2c.out;
  pFVar1->minIndex = local_2c.minIndex;
  return;
}

Assistant:

void PushOperand(Stack<Allocator>& operandStack, unsigned codepoint) {
        SizeType s = NewState(kRegexInvalidState, kRegexInvalidState, codepoint);
        *operandStack.template Push<Frag>() = Frag(s, s, s);
    }